

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::path::path(path *this,string_type *source,format fmt)

{
  string *in_RSI;
  string *in_RDI;
  format in_stack_0000006c;
  path *in_stack_00000070;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  postprocess_path_with_format(in_stack_00000070,in_stack_0000006c);
  return;
}

Assistant:

GHC_INLINE path::path(string_type&& source, format fmt)
    : _path(std::move(source))
{
    postprocess_path_with_format(fmt);
}